

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockHierarchyTest.cpp
# Opt level: O2

void __thiscall
TEST_MockHierarchyTest_EnableDisableWorkHierarchicallyWhenSupportIsDynamicallyCreated_Test::
~TEST_MockHierarchyTest_EnableDisableWorkHierarchicallyWhenSupportIsDynamicallyCreated_Test
          (TEST_MockHierarchyTest_EnableDisableWorkHierarchicallyWhenSupportIsDynamicallyCreated_Test
           *this)

{
  Utest::~Utest((Utest *)this);
  operator_delete(this,8);
  return;
}

Assistant:

TEST(MockHierarchyTest, EnableDisableWorkHierarchicallyWhenSupportIsDynamicallyCreated)
{
    mock().disable();
    mock("first").expectOneCall("boo");
    LONGS_EQUAL(0, mock("first").expectedCallsLeft());

    mock().enable();
    mock("second").expectOneCall("boo");
    LONGS_EQUAL(1, mock("second").expectedCallsLeft());

    mock().clear();
}